

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateServiceMethod
               (MethodDescriptor *method,Printer *printer)

{
  Descriptor *desc;
  string local_50;
  string local_30;
  
  UnderscoresToCamelCase(&local_30,*(string **)method,false);
  desc = MethodDescriptor::input_type(method);
  FullClassName<google::protobuf::Descriptor>(&local_50,desc,false);
  io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
            (printer,"public function ^camel_name^(\\^request_name^ $request);\n\n",
             (char (*) [11])"camel_name",&local_30,(char (*) [13])"request_name",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void GenerateServiceMethod(const MethodDescriptor* method,
                           io::Printer* printer) {
  printer->Print(
        "public function ^camel_name^(\\^request_name^ $request);\n\n",
        "camel_name", UnderscoresToCamelCase(method->name(), false),
        "request_name", FullClassName(
          method->input_type(), false)
  );
}